

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConnection.cxx
# Opt level: O3

void cmEventBasedConnection::on_read(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  long *plVar1;
  long *local_40 [2];
  long local_30 [2];
  
  plVar1 = (long *)stream->data;
  if (plVar1 != (long *)0x0) {
    if (nread < 0) {
      (**(code **)(*plVar1 + 0x50))(plVar1,nread & 0xffffffff);
    }
    else {
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char*>((string *)local_40,buf->base,buf->base + nread);
      (**(code **)(*plVar1 + 0x48))(plVar1,(string *)local_40);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
    }
  }
  if (buf->base != (char *)0x0) {
    operator_delete__(buf->base);
  }
  return;
}

Assistant:

void cmEventBasedConnection::on_read(uv_stream_t* stream, ssize_t nread,
                                     const uv_buf_t* buf)
{
  auto conn = reinterpret_cast<cmEventBasedConnection*>(stream->data);
  if (conn) {
    if (nread >= 0) {
      conn->ReadData(std::string(buf->base, buf->base + nread));
    } else {
      conn->OnDisconnect((int)nread);
    }
  }

  delete[](buf->base);
}